

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O2

void cvarfunc_fluid_interp(FIntCVar *self)

{
  uint uVar1;
  int iStack_8;
  
  uVar1 = self->Value;
  if ((int)uVar1 < 0) {
    FIntCVar::operator=(self,0);
    return;
  }
  switch(uVar1) {
  case 2:
    iStack_8 = 1;
    break;
  case 3:
  case 5:
    iStack_8 = 4;
    break;
  default:
    if (uVar1 < 8) {
      if (currSong != (MusInfo *)0x0) {
        (*currSong->_vptr_MusInfo[0x11])(currSong,"synth.interpolation");
        return;
      }
      return;
    }
  case 6:
    iStack_8 = 7;
  }
  FIntCVar::operator=(self,iStack_8);
  return;
}

Assistant:

inline operator int () const { return Value; }